

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void begin_3d(GPU_Target *screen)

{
  GPU_FlushBlitBuffer();
  GPU_MatrixMode(0);
  GPU_PushMatrix();
  GPU_LoadIdentity();
  GPU_MatrixMode(1);
  GPU_PushMatrix();
  GPU_LoadIdentity();
  return;
}

Assistant:

void begin_3d(GPU_Target* screen)
{
    GPU_FlushBlitBuffer();
    
    
    GPU_MatrixMode(GPU_MODELVIEW);
    GPU_PushMatrix();
    GPU_LoadIdentity();
    GPU_MatrixMode(GPU_PROJECTION);
    GPU_PushMatrix();
    GPU_LoadIdentity();
}